

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prival.c
# Opt level: O2

char * stumpless_get_prival_string(int prival)

{
  stumpless_severity severity;
  stumpless_facility facility;
  char *pcVar1;
  char *__s;
  size_t __n;
  size_t __n_00;
  char *__dest;
  
  severity = get_severity(prival);
  pcVar1 = stumpless_get_severity_string(severity);
  facility = get_facility(prival);
  __s = stumpless_get_facility_string(facility);
  __n = strlen(pcVar1);
  __n_00 = strlen(__s);
  __dest = (char *)alloc_mem(__n + __n_00 + 4);
  memcpy(__dest,pcVar1,__n);
  pcVar1 = __dest + __n;
  pcVar1[0] = ' ';
  pcVar1[1] = '|';
  pcVar1[2] = ' ';
  memcpy(pcVar1 + 3,__s,__n_00);
  __dest[__n_00 + 3 + __n] = '\0';
  return __dest;
}

Assistant:

const char *
stumpless_get_prival_string( int prival ) {
  const char *severity;
  const char *facility;
  size_t prival_string_size;
  char *prival_string;

  severity = stumpless_get_severity_string( get_severity( prival ) );
  facility = stumpless_get_facility_string( get_facility( prival ) );
   
  size_t len_severity = strlen(severity); // to not call strlen() mutiples times, unsure about impact
  size_t len_facility = strlen(facility);

  // +3 for formatting, +1 for termination
  prival_string_size = ( len_severity + len_facility + 4);
  prival_string = alloc_mem( prival_string_size );
  
  memcpy( prival_string, severity , len_severity); 
  memcpy( prival_string + len_severity, " | ", 3); // 3 is the size of " | "
  memcpy( prival_string + len_severity + 3, facility, len_facility);
  memcpy( prival_string + len_severity + 3 + len_facility, "\0", 1);
  
  return prival_string;
}